

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary.cc
# Opt level: O0

vector<fasttext::subentry,_std::allocator<fasttext::subentry>_> * __thiscall
fasttext::Dictionary::getSubIpaNgrams(Dictionary *this,int32_t i)

{
  const_reference pvVar1;
  int in_ESI;
  long in_RDI;
  
  if (in_ESI < 0) {
    __assert_fail("i >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/Aditi138[P]Embeddings/src/dictionary.cc"
                  ,0x62,
                  "const std::vector<subentry> &fasttext::Dictionary::getSubIpaNgrams(int32_t) const"
                 );
  }
  if (in_ESI < *(int *)(in_RDI + 0x94)) {
    pvVar1 = std::vector<fasttext::entry,_std::allocator<fasttext::entry>_>::operator[]
                       ((vector<fasttext::entry,_std::allocator<fasttext::entry>_> *)(in_RDI + 0x58)
                        ,(long)in_ESI);
    return &pvVar1->subipangram;
  }
  __assert_fail("i < nwords_",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/Aditi138[P]Embeddings/src/dictionary.cc"
                ,99,
                "const std::vector<subentry> &fasttext::Dictionary::getSubIpaNgrams(int32_t) const")
  ;
}

Assistant:

const std::vector<subentry>& Dictionary::getSubIpaNgrams(int32_t i) const {
  assert(i >= 0);
  assert(i < nwords_);
  return words_[i].subipangram;
}